

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# single_particleSpectra.cpp
# Opt level: O1

void __thiscall
singleParticleSpectra::calculate_three_particle_correlation_charge_dep
          (singleParticleSpectra *this,vector<double,_std::allocator<double>_> *event_Qn_p_real,
          vector<double,_std::allocator<double>_> *event_Qn_p_imag,
          vector<double,_std::allocator<double>_> *event_Qn_m_real,
          vector<double,_std::allocator<double>_> *event_Qn_m_imag,
          vector<double,_std::allocator<double>_> *event_Qn_real,
          vector<double,_std::allocator<double>_> *event_Qn_imag,
          vector<double,_std::allocator<double>_> *corr_ss,
          vector<double,_std::allocator<double>_> *corr_ss_err,
          vector<double,_std::allocator<double>_> *corr_os,
          vector<double,_std::allocator<double>_> *corr_os_err,
          vector<double,_std::allocator<double>_> *corr_ss_13,
          vector<double,_std::allocator<double>_> *corr_ss_13_err,
          vector<double,_std::allocator<double>_> *corr_os_13,
          vector<double,_std::allocator<double>_> *corr_os_13_err)

{
  int iVar1;
  pointer pdVar2;
  pointer pdVar3;
  pointer pdVar4;
  pointer pdVar5;
  vector<double,_std::allocator<double>_> *pvVar6;
  vector<double,_std::allocator<double>_> *event_Q1_real;
  vector<double,_std::allocator<double>_> *event_Q2_imag;
  long lVar7;
  size_type __n;
  size_type sVar8;
  double dVar9;
  allocator_type local_1d9;
  vector<double,_std::allocator<double>_> *local_1d8;
  vector<double,_std::allocator<double>_> *local_1d0;
  vector<double,_std::allocator<double>_> *local_1c8;
  vector<double,_std::allocator<double>_> temp_Cmnk_os_4;
  vector<double,_std::allocator<double>_> temp_Cmnk_os_3;
  vector<double,_std::allocator<double>_> temp_Cmnk_os_2;
  vector<double,_std::allocator<double>_> temp_Cmnk_os_1;
  vector<double,_std::allocator<double>_> temp_Cmnk_ss_4;
  vector<double,_std::allocator<double>_> temp_Cmnk_ss_3;
  value_type_conflict local_128;
  vector<double,_std::allocator<double>_> temp_Cmnk_os_4_err;
  vector<double,_std::allocator<double>_> temp_Cmnk_os_3_err;
  vector<double,_std::allocator<double>_> temp_Cmnk_os_2_err;
  vector<double,_std::allocator<double>_> temp_Cmnk_os_1_err;
  vector<double,_std::allocator<double>_> temp_Cmnk_ss_4_err;
  vector<double,_std::allocator<double>_> temp_Cmnk_ss_3_err;
  vector<double,_std::allocator<double>_> temp_Cmnk_ss_2_err;
  vector<double,_std::allocator<double>_> temp_Cmnk_ss_2;
  vector<double,_std::allocator<double>_> temp_Cmnk_ss_1_err;
  vector<double,_std::allocator<double>_> temp_Cmnk_ss_1;
  
  temp_Cmnk_ss_2.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  local_1d0 = event_Qn_m_real;
  local_1c8 = event_Qn_m_imag;
  std::vector<double,_std::allocator<double>_>::vector
            (&temp_Cmnk_ss_1,(long)this->num_corr,(value_type_conflict *)&temp_Cmnk_ss_2,
             (allocator_type *)&temp_Cmnk_ss_3);
  temp_Cmnk_ss_3.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  std::vector<double,_std::allocator<double>_>::vector
            (&temp_Cmnk_ss_2,(long)this->num_corr,(value_type_conflict *)&temp_Cmnk_ss_3,
             (allocator_type *)&temp_Cmnk_ss_4);
  temp_Cmnk_ss_4.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  std::vector<double,_std::allocator<double>_>::vector
            (&temp_Cmnk_ss_3,(long)this->num_corr,(value_type_conflict *)&temp_Cmnk_ss_4,
             (allocator_type *)&temp_Cmnk_ss_1_err);
  temp_Cmnk_ss_1_err.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  std::vector<double,_std::allocator<double>_>::vector
            (&temp_Cmnk_ss_4,(long)this->num_corr,(value_type_conflict *)&temp_Cmnk_ss_1_err,
             (allocator_type *)&temp_Cmnk_ss_2_err);
  pvVar6 = local_1c8;
  temp_Cmnk_ss_2_err.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1d8 = event_Qn_p_imag;
  std::vector<double,_std::allocator<double>_>::vector
            (&temp_Cmnk_ss_1_err,(long)this->num_corr,(value_type_conflict *)&temp_Cmnk_ss_2_err,
             (allocator_type *)&temp_Cmnk_ss_3_err);
  temp_Cmnk_ss_3_err.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  std::vector<double,_std::allocator<double>_>::vector
            (&temp_Cmnk_ss_2_err,(long)this->num_corr,(value_type_conflict *)&temp_Cmnk_ss_3_err,
             (allocator_type *)&temp_Cmnk_ss_4_err);
  temp_Cmnk_ss_4_err.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  std::vector<double,_std::allocator<double>_>::vector
            (&temp_Cmnk_ss_3_err,(long)this->num_corr,(value_type_conflict *)&temp_Cmnk_ss_4_err,
             (allocator_type *)&temp_Cmnk_os_1);
  temp_Cmnk_os_1.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  std::vector<double,_std::allocator<double>_>::vector
            (&temp_Cmnk_ss_4_err,(long)this->num_corr,(value_type_conflict *)&temp_Cmnk_os_1,
             (allocator_type *)&temp_Cmnk_os_2);
  calculate_three_particle_correlation
            (this,event_Qn_p_real,local_1d8,event_Qn_p_real,local_1d8,event_Qn_real,event_Qn_imag,0,
             &temp_Cmnk_ss_1,&temp_Cmnk_ss_1_err);
  calculate_three_particle_correlation
            (this,local_1d0,pvVar6,local_1d0,pvVar6,event_Qn_real,event_Qn_imag,0,&temp_Cmnk_ss_2,
             &temp_Cmnk_ss_2_err);
  calculate_three_particle_correlation
            (this,event_Qn_p_real,local_1d8,event_Qn_real,event_Qn_imag,event_Qn_p_real,local_1d8,3,
             &temp_Cmnk_ss_3,&temp_Cmnk_ss_3_err);
  calculate_three_particle_correlation
            (this,local_1d0,pvVar6,event_Qn_real,event_Qn_imag,local_1d0,pvVar6,3,&temp_Cmnk_ss_4,
             &temp_Cmnk_ss_4_err);
  __n = (size_type)this->num_corr;
  if (0 < (long)__n) {
    pdVar2 = (corr_ss->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pdVar3 = (corr_ss_err->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pdVar4 = (corr_ss_13->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pdVar5 = (corr_ss_13_err->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    sVar8 = 0;
    do {
      dVar9 = temp_Cmnk_ss_1.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[sVar8] +
              temp_Cmnk_ss_2.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[sVar8];
      pdVar2[sVar8] = pdVar2[sVar8] + dVar9;
      pdVar3[sVar8] = dVar9 * dVar9 + pdVar3[sVar8];
      dVar9 = temp_Cmnk_ss_3.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[sVar8] +
              temp_Cmnk_ss_4.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[sVar8];
      pdVar4[sVar8] = pdVar4[sVar8] + dVar9;
      pdVar5[sVar8] = dVar9 * dVar9 + pdVar5[sVar8];
      sVar8 = sVar8 + 1;
    } while (__n != sVar8);
  }
  temp_Cmnk_os_2.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  std::vector<double,_std::allocator<double>_>::vector
            (&temp_Cmnk_os_1,__n,(value_type_conflict *)&temp_Cmnk_os_2,
             (allocator_type *)&temp_Cmnk_os_3);
  temp_Cmnk_os_3.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  std::vector<double,_std::allocator<double>_>::vector
            (&temp_Cmnk_os_2,(long)this->num_corr,(value_type_conflict *)&temp_Cmnk_os_3,
             (allocator_type *)&temp_Cmnk_os_4);
  temp_Cmnk_os_4.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  std::vector<double,_std::allocator<double>_>::vector
            (&temp_Cmnk_os_3,(long)this->num_corr,(value_type_conflict *)&temp_Cmnk_os_4,
             (allocator_type *)&temp_Cmnk_os_1_err);
  temp_Cmnk_os_1_err.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  std::vector<double,_std::allocator<double>_>::vector
            (&temp_Cmnk_os_4,(long)this->num_corr,(value_type_conflict *)&temp_Cmnk_os_1_err,
             (allocator_type *)&temp_Cmnk_os_2_err);
  event_Q2_imag = local_1c8;
  temp_Cmnk_os_2_err.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  std::vector<double,_std::allocator<double>_>::vector
            (&temp_Cmnk_os_1_err,(long)this->num_corr,(value_type_conflict *)&temp_Cmnk_os_2_err,
             (allocator_type *)&temp_Cmnk_os_3_err);
  temp_Cmnk_os_3_err.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  std::vector<double,_std::allocator<double>_>::vector
            (&temp_Cmnk_os_2_err,(long)this->num_corr,(value_type_conflict *)&temp_Cmnk_os_3_err,
             (allocator_type *)&temp_Cmnk_os_4_err);
  temp_Cmnk_os_4_err.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  std::vector<double,_std::allocator<double>_>::vector
            (&temp_Cmnk_os_3_err,(long)this->num_corr,(value_type_conflict *)&temp_Cmnk_os_4_err,
             (allocator_type *)&local_128);
  local_128 = 0.0;
  std::vector<double,_std::allocator<double>_>::vector
            (&temp_Cmnk_os_4_err,(long)this->num_corr,&local_128,&local_1d9);
  event_Q1_real = local_1d0;
  pvVar6 = local_1d8;
  calculate_three_particle_correlation
            (this,event_Qn_p_real,local_1d8,local_1d0,event_Q2_imag,event_Qn_real,event_Qn_imag,1,
             &temp_Cmnk_os_1,&temp_Cmnk_os_1_err);
  calculate_three_particle_correlation
            (this,event_Q1_real,event_Q2_imag,event_Qn_p_real,pvVar6,event_Qn_real,event_Qn_imag,1,
             &temp_Cmnk_os_2,&temp_Cmnk_os_2_err);
  calculate_three_particle_correlation
            (this,event_Qn_p_real,pvVar6,event_Qn_real,event_Qn_imag,event_Q1_real,event_Q2_imag,4,
             &temp_Cmnk_os_3,&temp_Cmnk_os_3_err);
  calculate_three_particle_correlation
            (this,event_Q1_real,event_Q2_imag,event_Qn_real,event_Qn_imag,event_Qn_p_real,pvVar6,4,
             &temp_Cmnk_os_4,&temp_Cmnk_os_4_err);
  iVar1 = this->num_corr;
  if (0 < (long)iVar1) {
    pdVar2 = (corr_os->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pdVar3 = (corr_os_err->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pdVar4 = (corr_os_13->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pdVar5 = (corr_os_13_err->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    lVar7 = 0;
    do {
      dVar9 = temp_Cmnk_os_1.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[lVar7] +
              temp_Cmnk_os_2.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[lVar7];
      pdVar2[lVar7] = pdVar2[lVar7] + dVar9;
      pdVar3[lVar7] = dVar9 * dVar9 + pdVar3[lVar7];
      dVar9 = temp_Cmnk_os_3.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[lVar7] +
              temp_Cmnk_os_4.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[lVar7];
      pdVar4[lVar7] = pdVar4[lVar7] + dVar9;
      pdVar5[lVar7] = dVar9 * dVar9 + pdVar5[lVar7];
      lVar7 = lVar7 + 1;
    } while (iVar1 != lVar7);
  }
  if (temp_Cmnk_os_4_err.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(temp_Cmnk_os_4_err.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (temp_Cmnk_os_3_err.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(temp_Cmnk_os_3_err.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (temp_Cmnk_os_2_err.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(temp_Cmnk_os_2_err.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (temp_Cmnk_os_1_err.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(temp_Cmnk_os_1_err.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (temp_Cmnk_os_4.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(temp_Cmnk_os_4.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (temp_Cmnk_os_3.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(temp_Cmnk_os_3.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (temp_Cmnk_os_2.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(temp_Cmnk_os_2.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (temp_Cmnk_os_1.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(temp_Cmnk_os_1.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (temp_Cmnk_ss_4_err.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(temp_Cmnk_ss_4_err.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (temp_Cmnk_ss_3_err.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(temp_Cmnk_ss_3_err.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (temp_Cmnk_ss_2_err.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(temp_Cmnk_ss_2_err.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (temp_Cmnk_ss_1_err.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(temp_Cmnk_ss_1_err.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (temp_Cmnk_ss_4.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(temp_Cmnk_ss_4.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (temp_Cmnk_ss_3.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(temp_Cmnk_ss_3.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (temp_Cmnk_ss_2.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(temp_Cmnk_ss_2.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (temp_Cmnk_ss_1.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(temp_Cmnk_ss_1.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void singleParticleSpectra::calculate_three_particle_correlation_charge_dep(
    vector<double> &event_Qn_p_real, vector<double> &event_Qn_p_imag,
    vector<double> &event_Qn_m_real, vector<double> &event_Qn_m_imag,
    vector<double> &event_Qn_real, vector<double> &event_Qn_imag,
    vector<double> &corr_ss, vector<double> &corr_ss_err,
    vector<double> &corr_os, vector<double> &corr_os_err,
    vector<double> &corr_ss_13, vector<double> &corr_ss_13_err,
    vector<double> &corr_os_13, vector<double> &corr_os_13_err) {
    vector<double> temp_Cmnk_ss_1(num_corr, 0.);
    vector<double> temp_Cmnk_ss_2(num_corr, 0.);
    vector<double> temp_Cmnk_ss_3(num_corr, 0.);
    vector<double> temp_Cmnk_ss_4(num_corr, 0.);
    vector<double> temp_Cmnk_ss_1_err(num_corr, 0.);
    vector<double> temp_Cmnk_ss_2_err(num_corr, 0.);
    vector<double> temp_Cmnk_ss_3_err(num_corr, 0.);
    vector<double> temp_Cmnk_ss_4_err(num_corr, 0.);
    calculate_three_particle_correlation(
        event_Qn_p_real, event_Qn_p_imag, event_Qn_p_real, event_Qn_p_imag,
        event_Qn_real, event_Qn_imag, 0, temp_Cmnk_ss_1, temp_Cmnk_ss_1_err);
    calculate_three_particle_correlation(
        event_Qn_m_real, event_Qn_m_imag, event_Qn_m_real, event_Qn_m_imag,
        event_Qn_real, event_Qn_imag, 0, temp_Cmnk_ss_2, temp_Cmnk_ss_2_err);
    calculate_three_particle_correlation(
        event_Qn_p_real, event_Qn_p_imag, event_Qn_real, event_Qn_imag,
        event_Qn_p_real, event_Qn_p_imag, 3, temp_Cmnk_ss_3,
        temp_Cmnk_ss_3_err);
    calculate_three_particle_correlation(
        event_Qn_m_real, event_Qn_m_imag, event_Qn_real, event_Qn_imag,
        event_Qn_m_real, event_Qn_m_imag, 3, temp_Cmnk_ss_4,
        temp_Cmnk_ss_4_err);
    for (int i = 0; i < num_corr; i++) {
        double local_Cmnk_ss = temp_Cmnk_ss_1[i] + temp_Cmnk_ss_2[i];
        corr_ss[i] += local_Cmnk_ss;
        corr_ss_err[i] += local_Cmnk_ss * local_Cmnk_ss;
        double local_Cmnk_ss_13 = temp_Cmnk_ss_3[i] + temp_Cmnk_ss_4[i];
        corr_ss_13[i] += local_Cmnk_ss_13;
        corr_ss_13_err[i] += local_Cmnk_ss_13 * local_Cmnk_ss_13;
    }

    vector<double> temp_Cmnk_os_1(num_corr, 0.);
    vector<double> temp_Cmnk_os_2(num_corr, 0.);
    vector<double> temp_Cmnk_os_3(num_corr, 0.);
    vector<double> temp_Cmnk_os_4(num_corr, 0.);
    vector<double> temp_Cmnk_os_1_err(num_corr, 0.);
    vector<double> temp_Cmnk_os_2_err(num_corr, 0.);
    vector<double> temp_Cmnk_os_3_err(num_corr, 0.);
    vector<double> temp_Cmnk_os_4_err(num_corr, 0.);
    calculate_three_particle_correlation(
        event_Qn_p_real, event_Qn_p_imag, event_Qn_m_real, event_Qn_m_imag,
        event_Qn_real, event_Qn_imag, 1, temp_Cmnk_os_1, temp_Cmnk_os_1_err);
    calculate_three_particle_correlation(
        event_Qn_m_real, event_Qn_m_imag, event_Qn_p_real, event_Qn_p_imag,
        event_Qn_real, event_Qn_imag, 1, temp_Cmnk_os_2, temp_Cmnk_os_2_err);
    calculate_three_particle_correlation(
        event_Qn_p_real, event_Qn_p_imag, event_Qn_real, event_Qn_imag,
        event_Qn_m_real, event_Qn_m_imag, 4, temp_Cmnk_os_3,
        temp_Cmnk_os_3_err);
    calculate_three_particle_correlation(
        event_Qn_m_real, event_Qn_m_imag, event_Qn_real, event_Qn_imag,
        event_Qn_p_real, event_Qn_p_imag, 4, temp_Cmnk_os_4,
        temp_Cmnk_os_4_err);
    for (int i = 0; i < num_corr; i++) {
        double local_Cmnk_os = temp_Cmnk_os_1[i] + temp_Cmnk_os_2[i];
        corr_os[i] += local_Cmnk_os;
        corr_os_err[i] += local_Cmnk_os * local_Cmnk_os;
        double local_Cmnk_os_13 = temp_Cmnk_os_3[i] + temp_Cmnk_os_4[i];
        corr_os_13[i] += local_Cmnk_os_13;
        corr_os_13_err[i] += local_Cmnk_os_13 * local_Cmnk_os_13;
    }
}